

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O3

uint32_t * unpack15_32(uint32_t base,uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint32_t uVar2;
  
  *out = (*in & 0x7fff) + base;
  out[1] = (*in >> 0xf & 0x7fff) + base;
  uVar1 = *in;
  out[2] = uVar1 >> 0x1e;
  out[2] = (uVar1 >> 0x1e) + base + (in[1] & 0x1fff) * 4;
  out[3] = (in[1] >> 0xd & 0x7fff) + base;
  uVar1 = in[1];
  out[4] = uVar1 >> 0x1c;
  out[4] = (uVar1 >> 0x1c) + base + (in[2] & 0x7ff) * 0x10;
  out[5] = (in[2] >> 0xb & 0x7fff) + base;
  uVar1 = in[2];
  out[6] = uVar1 >> 0x1a;
  out[6] = (uVar1 >> 0x1a) + base + (in[3] & 0x1ff) * 0x40;
  out[7] = (in[3] >> 9 & 0x7fff) + base;
  uVar1 = in[3];
  out[8] = uVar1 >> 0x18;
  out[8] = (uVar1 >> 0x18) + base + (in[4] & 0x7f) * 0x100;
  out[9] = (in[4] >> 7 & 0x7fff) + base;
  uVar1 = in[4];
  out[10] = uVar1 >> 0x16;
  out[10] = (uVar1 >> 0x16) + base + (in[5] & 0x1f) * 0x400;
  out[0xb] = (in[5] >> 5 & 0x7fff) + base;
  uVar1 = in[5];
  out[0xc] = uVar1 >> 0x14;
  out[0xc] = (uVar1 >> 0x14) + base + (in[6] & 7) * 0x1000;
  out[0xd] = (in[6] >> 3 & 0x7fff) + base;
  uVar1 = in[6];
  out[0xe] = uVar1 >> 0x12;
  out[0xe] = (uVar1 >> 0x12) + base + (in[7] & 1) * 0x4000;
  out[0xf] = (in[7] >> 1 & 0x7fff) + base;
  out[0x10] = (*(ushort *)((long)in + 0x1e) & 0x7fff) + base;
  uVar2 = in[7];
  out[0x11] = -((int)uVar2 >> 0x1f);
  out[0x11] = -((int)uVar2 >> 0x1f) + base + (in[8] & 0x3fff) * 2;
  out[0x12] = (in[8] >> 0xe & 0x7fff) + base;
  uVar1 = in[8];
  out[0x13] = uVar1 >> 0x1d;
  out[0x13] = (uVar1 >> 0x1d) + base + (in[9] & 0xfff) * 8;
  out[0x14] = (in[9] >> 0xc & 0x7fff) + base;
  uVar1 = in[9];
  out[0x15] = uVar1 >> 0x1b;
  out[0x15] = (uVar1 >> 0x1b) + base + (in[10] & 0x3ff) * 0x20;
  out[0x16] = (in[10] >> 10 & 0x7fff) + base;
  uVar1 = in[10];
  out[0x17] = uVar1 >> 0x19;
  out[0x17] = (uVar1 >> 0x19) + base + (in[0xb] & 0xff) * 0x80;
  out[0x18] = (in[0xb] >> 8 & 0x7fff) + base;
  uVar1 = in[0xb];
  out[0x19] = uVar1 >> 0x17;
  out[0x19] = (uVar1 >> 0x17) + base + (in[0xc] & 0x3f) * 0x200;
  out[0x1a] = (in[0xc] >> 6 & 0x7fff) + base;
  uVar1 = in[0xc];
  out[0x1b] = uVar1 >> 0x15;
  out[0x1b] = (uVar1 >> 0x15) + base + (in[0xd] & 0xf) * 0x800;
  out[0x1c] = (in[0xd] >> 4 & 0x7fff) + base;
  uVar1 = in[0xd];
  out[0x1d] = uVar1 >> 0x13;
  out[0x1d] = (uVar1 >> 0x13) + base + (in[0xe] & 3) * 0x2000;
  out[0x1e] = (in[0xe] >> 2 & 0x7fff) + base;
  out[0x1f] = (in[0xe] >> 0x11) + base;
  return in + 0xf;
}

Assistant:

uint32_t * unpack15_32( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out = ( (*in) >>  0  )   % (1U << 15 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  15  )   % (1U << 15 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  30  ) ;
    ++in;
    *out |= ((*in) % (1U<< 13 ))<<( 15 - 13 );
    *out += base;
    out++;
    *out = ( (*in) >>  13  )   % (1U << 15 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  28  ) ;
    ++in;
    *out |= ((*in) % (1U<< 11 ))<<( 15 - 11 );
    *out += base;
    out++;
    *out = ( (*in) >>  11  )   % (1U << 15 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  26  ) ;
    ++in;
    *out |= ((*in) % (1U<< 9 ))<<( 15 - 9 );
    *out += base;
    out++;
    *out = ( (*in) >>  9  )   % (1U << 15 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  24  ) ;
    ++in;
    *out |= ((*in) % (1U<< 7 ))<<( 15 - 7 );
    *out += base;
    out++;
    *out = ( (*in) >>  7  )   % (1U << 15 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  22  ) ;
    ++in;
    *out |= ((*in) % (1U<< 5 ))<<( 15 - 5 );
    *out += base;
    out++;
    *out = ( (*in) >>  5  )   % (1U << 15 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  20  ) ;
    ++in;
    *out |= ((*in) % (1U<< 3 ))<<( 15 - 3 );
    *out += base;
    out++;
    *out = ( (*in) >>  3  )   % (1U << 15 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  18  ) ;
    ++in;
    *out |= ((*in) % (1U<< 1 ))<<( 15 - 1 );
    *out += base;
    out++;
    *out = ( (*in) >>  1  )   % (1U << 15 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  16  )   % (1U << 15 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  31  ) ;
    ++in;
    *out |= ((*in) % (1U<< 14 ))<<( 15 - 14 );
    *out += base;
    out++;
    *out = ( (*in) >>  14  )   % (1U << 15 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  29  ) ;
    ++in;
    *out |= ((*in) % (1U<< 12 ))<<( 15 - 12 );
    *out += base;
    out++;
    *out = ( (*in) >>  12  )   % (1U << 15 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  27  ) ;
    ++in;
    *out |= ((*in) % (1U<< 10 ))<<( 15 - 10 );
    *out += base;
    out++;
    *out = ( (*in) >>  10  )   % (1U << 15 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  25  ) ;
    ++in;
    *out |= ((*in) % (1U<< 8 ))<<( 15 - 8 );
    *out += base;
    out++;
    *out = ( (*in) >>  8  )   % (1U << 15 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  23  ) ;
    ++in;
    *out |= ((*in) % (1U<< 6 ))<<( 15 - 6 );
    *out += base;
    out++;
    *out = ( (*in) >>  6  )   % (1U << 15 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  21  ) ;
    ++in;
    *out |= ((*in) % (1U<< 4 ))<<( 15 - 4 );
    *out += base;
    out++;
    *out = ( (*in) >>  4  )   % (1U << 15 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  19  ) ;
    ++in;
    *out |= ((*in) % (1U<< 2 ))<<( 15 - 2 );
    *out += base;
    out++;
    *out = ( (*in) >>  2  )   % (1U << 15 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  17  ) ;
    ++in;
    *out += base;
    out++;

    return in;
}